

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O0

void __thiscall SDLInputJoystick::SetDefaultConfig(SDLInputJoystick *this)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  undefined1 local_40 [8];
  AxisInfo info;
  int i;
  SDLInputJoystick *this_local;
  
  info._36_4_ = 0;
  while( true ) {
    uVar1 = info._36_4_;
    iVar2 = (*(this->super_IJoystickConfig)._vptr_IJoystickConfig[5])();
    if (iVar2 <= (int)uVar1) break;
    AxisInfo::AxisInfo((AxisInfo *)local_40);
    if ((int)info._36_4_ < this->NumAxes) {
      FString::Format((FString *)local_40,"Axis %d",(ulong)(info._36_4_ + 1));
    }
    else {
      uVar3 = info._36_4_ - this->NumAxes;
      FString::Format((FString *)local_40,"Hat %d (%c)",(ulong)((int)uVar3 / 2 + 1),
                      (ulong)(uVar3 == (uVar3 - ((int)uVar3 >> 0x1f) & 0xfffffffe) ^ 0x79));
    }
    info.Name.Chars._0_4_ = 0x358637bd;
    info.Name.Chars._4_4_ = 0x3f800000;
    info.GameAxis = JOYAXIS_Yaw;
    info._20_4_ = 0;
    info.Value._0_1_ = 0;
    if ((int)info._36_4_ < 5) {
      info.DeadZone = (float)DefaultAxes[(int)info._36_4_];
    }
    else {
      info.DeadZone = -NAN;
    }
    TArray<SDLInputJoystick::AxisInfo,_SDLInputJoystick::AxisInfo>::Push
              (&this->Axes,(AxisInfo *)local_40);
    AxisInfo::~AxisInfo((AxisInfo *)local_40);
    info._36_4_ = info._36_4_ + 1;
  }
  return;
}

Assistant:

void SetDefaultConfig()
	{
		for(int i = 0;i < GetNumAxes();i++)
		{
			AxisInfo info;
			if(i < NumAxes)
				info.Name.Format("Axis %d", i+1);
			else
				info.Name.Format("Hat %d (%c)", (i-NumAxes)/2 + 1, (i-NumAxes)%2 == 0 ? 'x' : 'y');
			info.DeadZone = MIN_DEADZONE;
			info.Multiplier = 1.0f;
			info.Value = 0.0;
			info.ButtonValue = 0;
			if(i >= 5)
				info.GameAxis = JOYAXIS_None;
			else
				info.GameAxis = DefaultAxes[i];
			Axes.Push(info);
		}
	}